

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *name;
  cmGlobalGenerator *pcVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  cmGeneratorTarget *this_01;
  ostream *poVar6;
  _Alloc_hider value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *o;
  pointer pbVar7;
  cmList objects;
  string reason;
  cmValue imp;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  name = (parameters->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,name);
  if (this_01 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar6 = std::operator<<((ostream *)&e,"Objects of target \"");
    poVar6 = std::operator<<(poVar6,(string *)name);
    std::operator<<(poVar6,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&reason,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&reason,(string *)&objects);
  }
  else {
    TVar4 = cmGeneratorTarget::GetType(this_01);
    if (TVar4 < UTILITY) {
      pcVar1 = context->LG->GlobalGenerator;
      reason._M_dataplus._M_p = (pointer)&reason.field_2;
      reason._M_string_length = 0;
      reason.field_2._M_local_buf[0] = '\0';
      if ((context->EvaluateForBuildsystem == false) &&
         (bVar3 = cmTarget::HasKnownObjectFileLocation(this_01->Target,&reason), !bVar3)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar6 = std::operator<<((ostream *)&e,
                                 "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake (limited"
                                );
        poVar6 = std::operator<<(poVar6,(string *)&reason);
        std::operator<<(poVar6,").  It is not suitable for writing out elsewhere.");
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&objects,content);
        std::__cxx11::stringbuf::str();
        reportError(context,(string *)&objects,(string *)&imp);
        std::__cxx11::string::~string((string *)&imp);
        std::__cxx11::string::~string((string *)&objects);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::__cxx11::string::~string((string *)&reason);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::~string((string *)&reason);
      objects.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      objects.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objects.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = cmGeneratorTarget::IsImported(this_01);
      if (bVar3) {
        reason._M_dataplus._M_p = (pointer)0x0;
        imp.Value = (string *)0x0;
        _e = (pointer)local_198;
        local_198[0]._M_local_buf[0] = '\0';
        bVar3 = cmTarget::GetMappedConfig
                          (this_01->Target,&context->Config,(cmValue *)&reason,&imp,(string *)&e);
        if (bVar3) {
          value = reason._M_dataplus;
          if (reason._M_dataplus._M_p == (pointer)0x0) {
            value._M_p = (pointer)&cmValue::Empty_abi_cxx11_;
          }
          cmList::assign(&objects,(string *)value._M_p,Yes,No);
        }
        context->HadContextSensitiveCondition = true;
      }
      else {
        cmGeneratorTarget::GetTargetObjectNames(this_01,&context->Config,&objects.Values);
        _e = (pointer)local_198;
        local_198[0]._M_local_buf[0] = '\0';
        if ((context->EvaluateForBuildsystem == true) &&
           (iVar5 = (*pcVar1->_vptr_cmGlobalGenerator[0x38])(pcVar1), (char)iVar5 == '\0')) {
          std::__cxx11::string::_M_assign((string *)&e);
          bVar3 = cmGeneratorTarget::HasContextDependentSources(this_01);
          context->HadContextSensitiveCondition = bVar3;
        }
        else {
          cmGeneratorTarget::GetObjectDirectory(&reason,this_01,&context->Config);
          std::__cxx11::string::operator=((string *)&e,(string *)&reason);
          std::__cxx11::string::~string((string *)&reason);
          context->HadContextSensitiveCondition = true;
        }
        pbVar2 = objects.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar7 = objects.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2;
            pbVar7 = pbVar7 + 1) {
          cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                    (&reason,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e
                     ,pbVar7);
          std::__cxx11::string::operator=((string *)pbVar7,(string *)&reason);
          std::__cxx11::string::~string((string *)&reason);
        }
      }
      std::__cxx11::string::~string((string *)&e);
      pbVar2 = objects.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = context->LG->Makefile;
      for (pbVar7 = objects.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1
          ) {
        cmMakefile::AddTargetObject(this_00,name,pbVar7);
      }
      cmList::to_string_abi_cxx11_(__return_storage_ptr__,&objects);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&objects.Values);
      return __return_storage_ptr__;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar6 = std::operator<<((ostream *)&e,"Objects of target \"");
    poVar6 = std::operator<<(poVar6,(string *)name);
    poVar6 = std::operator<<(poVar6,"\" referenced but is not one of the allowed target types ");
    std::operator<<(poVar6,"(EXECUTABLE, STATIC, SHARED, MODULE, OBJECT).");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&reason,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&reason,(string *)&objects);
  }
  std::__cxx11::string::~string((string *)&objects);
  std::__cxx11::string::~string((string *)&reason);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string const& tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::STATIC_LIBRARY &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY &&
        type != cmStateEnums::OBJECT_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not one of the allowed target types "
        << "(EXECUTABLE, STATIC, SHARED, MODULE, OBJECT).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    {
      std::string reason;
      if (!context->EvaluateForBuildsystem &&
          !gt->Target->HasKnownObjectFileLocation(&reason)) {
        std::ostringstream e;
        e << "The evaluation of the TARGET_OBJECTS generator expression "
             "is only suitable for consumption by CMake (limited"
          << reason
          << ").  "
             "It is not suitable for writing out elsewhere.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }

    cmList objects;

    if (gt->IsImported()) {
      cmValue loc = nullptr;
      cmValue imp = nullptr;
      std::string suffix;
      if (gt->Target->GetMappedConfig(context->Config, loc, imp, suffix)) {
        objects.assign(*loc);
      }
      context->HadContextSensitiveCondition = true;
    } else {
      gt->GetTargetObjectNames(context->Config, objects);

      std::string obj_dir;
      if (context->EvaluateForBuildsystem && !gg->SupportsCrossConfigs()) {
        // Use object file directory with buildsystem placeholder.
        obj_dir = gt->ObjectDirectory;
        context->HadContextSensitiveCondition =
          gt->HasContextDependentSources();
      } else {
        // Use object file directory with per-config location.
        obj_dir = gt->GetObjectDirectory(context->Config);
        context->HadContextSensitiveCondition = true;
      }

      for (auto& o : objects) {
        o = cmStrCat(obj_dir, o);
      }
    }

    // Create the cmSourceFile instances in the referencing directory.
    cmMakefile* mf = context->LG->GetMakefile();
    for (std::string const& o : objects) {
      mf->AddTargetObject(tgtName, o);
    }

    return objects.to_string();
  }